

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O1

void monitor_list_destroy(monitor_list *monitor_list)

{
  node *pnVar1;
  
  free(monitor_list->extension);
  for (pnVar1 = monitor_list->monitors->head; pnVar1 != (node *)0x0; pnVar1 = pnVar1->next) {
    free(pnVar1->data);
  }
  list_destroy(monitor_list->monitors);
  free(monitor_list);
  return;
}

Assistant:

void monitor_list_destroy(struct monitor_list *monitor_list)
{
        free(monitor_list->extension);
        monitors_destroy(monitor_list->monitors);
        list_destroy(monitor_list->monitors);
        free(monitor_list);
}